

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

bool WriteToFile(string *path,Span<const_unsigned_char> in)

{
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  
  __s = fopen((path->_M_dataplus)._M_p,"wb");
  if (__s != (FILE *)0x0) {
    sVar1 = fwrite(in.data_,in.size_,1,__s);
    bVar2 = true;
    if (sVar1 == 1) goto LAB_001258d9;
  }
  WriteToFile();
  bVar2 = false;
LAB_001258d9:
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  return bVar2;
}

Assistant:

bool WriteToFile(const std::string &path, bssl::Span<const uint8_t> in) {
  ScopedFILE file(fopen(path.c_str(), "wb"));
  if (!file) {
    fprintf(stderr, "Failed to open '%s': %s\n", path.c_str(), strerror(errno));
    return false;
  }
  if (fwrite(in.data(), in.size(), 1, file.get()) != 1) {
    fprintf(stderr, "Failed to write to '%s': %s\n", path.c_str(),
            strerror(errno));
    return false;
  }
  return true;
}